

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O3

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  undefined8 *puVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined1 (*pauVar14) [28];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  uint uVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined1 auVar145 [12];
  undefined1 auVar146 [28];
  undefined1 auVar147 [28];
  int iVar148;
  uint uVar149;
  uint uVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  int iVar154;
  float *pfVar155;
  float *pfVar156;
  float *pfVar157;
  float *pfVar158;
  void *pvVar159;
  int *piVar160;
  size_t sVar161;
  undefined8 uVar162;
  float fVar163;
  float fVar164;
  float in_register_0000129c;
  float in_register_000012dc;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar178 [64];
  float in_register_0000149c;
  float fVar179;
  float fVar180;
  float fVar181;
  float in_register_000014dc;
  float in_register_0000159c;
  float fVar182;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  iVar18 = bottom_blob->c;
  if (0 < (long)iVar18) {
    uVar19 = top_blob->w;
    iVar20 = top_blob->h;
    lVar153 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        piVar160 = (int *)0x0;
        pvVar159 = (void *)0x0;
        sVar161 = 0;
        uVar162 = 0;
      }
      else {
        ppvVar1 = &_bias->data + lVar153 * 4;
        pvVar159 = *ppvVar1;
        piVar160 = (int *)ppvVar1[1];
        sVar161 = (size_t)ppvVar1[2];
        uVar162 = ppvVar1[3];
      }
      local_1f8 = SUB84(pvVar159,0);
      fStack_1f4 = (float)((ulong)pvVar159 >> 0x20);
      fStack_1f0 = SUB84(piVar160,0);
      fStack_1ec = (float)((ulong)piVar160 >> 0x20);
      fStack_1e8 = (float)sVar161;
      fStack_1e4 = (float)(sVar161 >> 0x20);
      fStack_1e0 = (float)uVar162;
      fStack_1dc = (float)((ulong)uVar162 >> 0x20);
      if (0 < iVar20) {
        pfVar157 = (float *)(top_blob->cstep * lVar153 * top_blob->elemsize + (long)top_blob->data);
        lVar151 = kernel->w * lVar153 * kernel->elemsize;
        pvVar159 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar159 + lVar151);
        auVar145 = *pauVar2;
        auVar144 = *pauVar2;
        local_198 = (float)*(undefined8 *)*pauVar2;
        fStack_194 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_190 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_18c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_188 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_184 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_180 = (float)*(undefined8 *)pauVar2[2];
        fStack_17c = (float)((ulong)*(undefined8 *)pauVar2[2] >> 0x20);
        pauVar2 = (undefined1 (*) [12])((long)pvVar159 + lVar151 + 0x20);
        auVar143 = *pauVar2;
        local_178 = (float)*(undefined8 *)*pauVar2;
        fStack_174 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_170 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_16c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_168 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_164 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_160 = (float)*(undefined8 *)pauVar2[2];
        fStack_15c = (float)((ulong)*(undefined8 *)pauVar2[2] >> 0x20);
        puVar4 = (undefined8 *)((long)pvVar159 + lVar151 + 0x40);
        uVar162 = *puVar4;
        uVar132 = puVar4[1];
        uVar133 = puVar4[2];
        uVar134 = puVar4[3];
        pfVar156 = (float *)((long)pvVar159 + lVar151 + 0x60);
        fVar100 = *pfVar156;
        fVar101 = pfVar156[1];
        fVar102 = pfVar156[2];
        fVar103 = pfVar156[3];
        fVar104 = pfVar156[4];
        fVar105 = pfVar156[5];
        fVar106 = pfVar156[6];
        fVar107 = pfVar156[7];
        auVar15 = *(undefined1 (*) [32])((long)pvVar159 + lVar151 + 0x80);
        pfVar156 = (float *)((long)pvVar159 + lVar151 + 0xa0);
        fVar124 = *pfVar156;
        fVar125 = pfVar156[1];
        fVar126 = pfVar156[2];
        fVar127 = pfVar156[3];
        fVar128 = pfVar156[4];
        fVar129 = pfVar156[5];
        fVar130 = pfVar156[6];
        fVar131 = pfVar156[7];
        pauVar14 = (undefined1 (*) [28])((long)pvVar159 + lVar151 + 0xc0);
        fVar108 = *(float *)*pauVar14;
        fVar109 = *(float *)(*pauVar14 + 4);
        fVar110 = *(float *)(*pauVar14 + 8);
        fVar111 = *(float *)(*pauVar14 + 0xc);
        fVar112 = *(float *)(*pauVar14 + 0x10);
        fVar113 = *(float *)(*pauVar14 + 0x14);
        fVar114 = *(float *)(*pauVar14 + 0x18);
        auVar146 = *pauVar14;
        fVar115 = *(float *)pauVar14[1];
        pauVar14 = (undefined1 (*) [28])((long)pvVar159 + lVar151 + 0xe0);
        fVar116 = *(float *)*pauVar14;
        fVar117 = *(float *)(*pauVar14 + 4);
        fVar118 = *(float *)(*pauVar14 + 8);
        fVar119 = *(float *)(*pauVar14 + 0xc);
        fVar120 = *(float *)(*pauVar14 + 0x10);
        fVar121 = *(float *)(*pauVar14 + 0x14);
        fVar122 = *(float *)(*pauVar14 + 0x18);
        auVar147 = *pauVar14;
        fVar123 = *(float *)pauVar14[1];
        auVar16 = *(undefined1 (*) [32])((long)pvVar159 + lVar151 + 0x100);
        auVar178 = ZEXT3264(auVar16);
        pfVar158 = (float *)(bottom_blob->cstep * lVar153 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
        lVar151 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar156 = (float *)((long)pfVar158 + lVar151 * 2);
        pfVar155 = (float *)(lVar151 + (long)pfVar158);
        iVar154 = 0;
        fVar164 = fVar107;
        do {
          fStack_154 = (float)((ulong)uVar162 >> 0x20);
          fStack_14c = (float)((ulong)uVar132 >> 0x20);
          fStack_144 = (float)((ulong)uVar133 >> 0x20);
          local_1b8 = auVar15._0_4_;
          fStack_1b4 = auVar15._4_4_;
          fStack_1b0 = auVar15._8_4_;
          fStack_1ac = auVar15._12_4_;
          fStack_1a8 = auVar15._16_4_;
          fStack_1a4 = auVar15._20_4_;
          fStack_1a0 = auVar15._24_4_;
          local_b8 = auVar16._0_4_;
          fStack_b4 = auVar16._4_4_;
          fStack_b0 = auVar16._8_4_;
          fStack_ac = auVar16._12_4_;
          fStack_a8 = auVar16._16_4_;
          fStack_a4 = auVar16._20_4_;
          fStack_a0 = auVar16._24_4_;
          fStack_9c = auVar16._28_4_;
          local_158 = (float)uVar162;
          fStack_150 = (float)uVar132;
          fStack_148 = (float)uVar133;
          fStack_140 = (float)uVar134;
          if ((int)uVar19 < 8) {
            uVar150 = 0;
          }
          else {
            iVar148 = 7;
            do {
              fVar164 = pfVar158[1];
              fVar21 = pfVar158[2];
              fVar166 = pfVar158[3];
              fVar167 = pfVar158[4];
              fVar168 = pfVar158[5];
              fVar179 = pfVar158[6];
              fVar27 = pfVar158[8];
              fVar30 = pfVar158[9];
              fVar22 = pfVar158[10];
              fVar23 = pfVar158[0xb];
              fVar24 = pfVar158[0xc];
              fVar25 = pfVar158[0xd];
              fVar26 = pfVar158[0xe];
              fVar28 = pfVar158[0xf];
              fVar29 = pfVar158[0x10];
              fVar31 = pfVar158[0x11];
              fVar32 = pfVar158[0x12];
              fVar33 = pfVar158[0x13];
              fVar34 = pfVar158[0x14];
              fVar35 = pfVar158[0x15];
              fVar36 = pfVar158[0x16];
              fVar37 = pfVar158[0x17];
              fVar38 = pfVar158[0x18];
              fVar39 = pfVar158[0x19];
              fVar40 = pfVar158[0x1a];
              fVar41 = pfVar158[0x1b];
              fVar42 = pfVar158[0x1c];
              fVar43 = pfVar158[0x1d];
              fVar44 = pfVar158[0x1e];
              fVar45 = pfVar158[0x1f];
              fVar46 = pfVar155[1];
              fVar47 = pfVar155[2];
              fVar48 = pfVar155[3];
              fVar49 = pfVar155[4];
              fVar50 = pfVar155[5];
              fVar51 = pfVar155[6];
              fVar52 = pfVar155[8];
              fVar53 = pfVar155[9];
              fVar54 = pfVar155[10];
              fVar55 = pfVar155[0xb];
              fVar56 = pfVar155[0xc];
              fVar57 = pfVar155[0xd];
              fVar58 = pfVar155[0xe];
              fVar59 = pfVar155[0xf];
              fVar60 = pfVar155[0x10];
              fVar173 = pfVar155[0x11];
              fVar61 = pfVar155[0x12];
              fVar62 = pfVar155[0x13];
              fVar63 = pfVar155[0x14];
              fVar64 = pfVar155[0x15];
              fVar65 = pfVar155[0x16];
              fVar66 = pfVar155[0x18];
              fVar67 = pfVar155[0x19];
              fVar68 = pfVar155[0x1a];
              fVar69 = pfVar155[0x1b];
              fVar70 = pfVar155[0x1c];
              fVar71 = pfVar155[0x1d];
              fVar72 = pfVar155[0x1e];
              fVar73 = pfVar155[0x1f];
              fVar74 = pfVar156[1];
              fVar75 = pfVar156[2];
              fVar76 = pfVar156[3];
              fVar77 = pfVar156[4];
              fVar78 = pfVar156[5];
              fVar79 = pfVar156[6];
              fVar80 = pfVar156[8];
              fVar172 = pfVar156[9];
              fVar81 = pfVar156[10];
              fVar82 = pfVar156[0xb];
              fVar83 = pfVar156[0xc];
              fVar84 = pfVar156[0xd];
              fVar85 = pfVar156[0xe];
              fVar86 = pfVar156[0x10];
              fVar87 = pfVar156[0x11];
              fVar88 = pfVar156[0x12];
              fVar89 = pfVar156[0x13];
              fVar90 = pfVar156[0x14];
              fVar91 = pfVar156[0x15];
              fVar163 = pfVar156[0x16];
              fVar170 = pfVar156[0x17];
              fVar175 = pfVar156[0x18];
              fVar176 = pfVar156[0x19];
              fVar92 = pfVar156[0x1a];
              fVar177 = pfVar156[0x1b];
              fVar180 = pfVar156[0x1c];
              fVar181 = pfVar156[0x1d];
              fVar182 = pfVar156[0x1e];
              fVar93 = pfVar156[0x1f];
              fVar169 = fVar131 + in_register_0000159c + fVar123;
              fVar171 = fVar107 + fVar123 + fVar107;
              fVar174 = fVar59 + fVar59 + fVar107;
              fVar165 = fVar59 + pfVar156[0xf] + fVar169;
              *pfVar157 = local_198 * *pfVar158 + local_1f8 +
                          fVar29 * local_158 + fVar27 * local_178 +
                          fVar100 * *pfVar155 + fVar52 * local_1b8 + fVar60 * fVar124 +
                          fVar108 * *pfVar156 + fVar80 * fVar116 + fVar86 * local_b8;
              pfVar157[1] = fStack_194 * fVar164 + fStack_1f4 +
                            fVar31 * fStack_154 + fVar30 * fStack_174 +
                            fVar101 * fVar46 + fVar53 * fStack_1b4 + fVar173 * fVar125 +
                            fVar109 * fVar74 + fVar172 * fVar117 + fVar87 * fStack_b4;
              pfVar157[2] = fStack_190 * fVar21 + fStack_1f0 +
                            fVar32 * fStack_150 + fVar22 * fStack_170 +
                            fVar102 * fVar47 + fVar54 * fStack_1b0 + fVar61 * fVar126 +
                            fVar110 * fVar75 + fVar81 * fVar118 + fVar88 * fStack_b0;
              pfVar157[3] = fStack_18c * fVar166 + fStack_1ec +
                            fVar33 * fStack_14c + fVar23 * fStack_16c +
                            fVar103 * fVar48 + fVar55 * fStack_1ac + fVar62 * fVar127 +
                            fVar111 * fVar76 + fVar82 * fVar119 + fVar89 * fStack_ac;
              pfVar157[4] = fStack_188 * fVar167 + fStack_1e8 +
                            fVar34 * fStack_148 + fVar24 * fStack_168 +
                            fVar104 * fVar49 + fVar56 * fStack_1a8 + fVar63 * fVar128 +
                            fVar112 * fVar77 + fVar83 * fVar120 + fVar90 * fStack_a8;
              pfVar157[5] = fStack_184 * fVar168 + fStack_1e4 +
                            fVar35 * fStack_144 + fVar25 * fStack_164 +
                            fVar105 * fVar50 + fVar57 * fStack_1a4 + fVar64 * fVar129 +
                            fVar113 * fVar78 + fVar84 * fVar121 + fVar91 * fStack_a4;
              pfVar157[6] = fStack_180 * fVar179 + fStack_1e0 +
                            fVar36 * fStack_140 + fVar26 * fStack_160 +
                            fVar106 * fVar51 + fVar58 * fStack_1a0 + fVar65 * fVar130 +
                            fVar114 * fVar79 + fVar85 * fVar122 + fVar163 * fStack_a0;
              pfVar157[7] = fStack_17c + fStack_1dc + in_register_000014dc + in_register_000012dc +
                            fVar169 + fVar171;
              fVar166 = fVar28 + fStack_1dc + fVar59 + fVar107 + fVar165 + fVar174 + fVar165;
              fVar164 = pfVar158[0x20];
              fVar28 = pfVar158[0x21];
              fVar46 = pfVar158[0x22];
              fVar47 = pfVar158[0x23];
              fVar48 = pfVar158[0x24];
              fVar49 = pfVar158[0x25];
              fVar50 = pfVar158[0x26];
              fVar21 = pfVar158[0x27];
              fVar51 = pfVar155[0x20];
              fVar59 = pfVar155[0x21];
              fVar74 = pfVar155[0x22];
              fVar75 = pfVar155[0x23];
              fVar76 = pfVar155[0x24];
              fVar77 = pfVar155[0x25];
              fVar78 = pfVar155[0x26];
              fVar79 = pfVar156[0x20];
              fVar165 = pfVar156[0x21];
              fVar94 = pfVar156[0x22];
              fVar95 = pfVar156[0x23];
              fVar96 = pfVar156[0x24];
              fVar97 = pfVar156[0x25];
              fVar98 = pfVar156[0x26];
              pfVar157[8] = fVar27 * local_198 + local_1f8 + fVar52 * fVar100 + fVar29 * local_178 +
                            fVar60 * local_1b8 + fVar80 * fVar108 + fVar86 * fVar116 +
                            fVar38 * local_158 + fVar66 * fVar124 + fVar175 * local_b8;
              pfVar157[9] = fVar30 * fStack_194 + fStack_1f4 +
                            fVar53 * fVar101 + fVar31 * fStack_174 +
                            fVar173 * fStack_1b4 + fVar172 * fVar109 + fVar87 * fVar117 +
                            fVar39 * fStack_154 + fVar67 * fVar125 + fVar176 * fStack_b4;
              pfVar157[10] = fVar22 * fStack_190 + fStack_1f0 +
                             fVar54 * fVar102 + fVar32 * fStack_170 +
                             fVar61 * fStack_1b0 + fVar81 * fVar110 + fVar88 * fVar118 +
                             fVar40 * fStack_150 + fVar68 * fVar126 + fVar92 * fStack_b0;
              pfVar157[0xb] =
                   fVar23 * fStack_18c + fStack_1ec + fVar55 * fVar103 + fVar33 * fStack_16c +
                   fVar62 * fStack_1ac + fVar82 * fVar111 + fVar89 * fVar119 +
                   fVar41 * fStack_14c + fVar69 * fVar127 + fVar177 * fStack_ac;
              pfVar157[0xc] =
                   fVar24 * fStack_188 + fStack_1e8 + fVar56 * fVar104 + fVar34 * fStack_168 +
                   fVar63 * fStack_1a8 + fVar83 * fVar112 + fVar90 * fVar120 +
                   fVar42 * fStack_148 + fVar70 * fVar128 + fVar180 * fStack_a8;
              pfVar157[0xd] =
                   fVar25 * fStack_184 + fStack_1e4 + fVar57 * fVar105 + fVar35 * fStack_164 +
                   fVar64 * fStack_1a4 + fVar84 * fVar113 + fVar91 * fVar121 +
                   fVar43 * fStack_144 + fVar71 * fVar129 + fVar181 * fStack_a4;
              pfVar157[0xe] =
                   fVar26 * fStack_180 + fStack_1e0 + fVar58 * fVar106 + fVar36 * fStack_160 +
                   fVar65 * fStack_1a0 + fVar85 * fVar114 + fVar163 * fVar122 +
                   fVar44 * fStack_140 + fVar72 * fVar130 + fVar182 * fStack_a0;
              pfVar157[0xf] = fVar166;
              fVar167 = fVar166 + fVar171 + fVar169 + fVar174;
              fVar22 = pfVar158[0x28];
              fVar23 = pfVar158[0x29];
              fVar24 = pfVar158[0x2a];
              fVar25 = pfVar158[0x2b];
              fVar26 = pfVar158[0x2c];
              fVar52 = pfVar158[0x2d];
              fVar53 = pfVar158[0x2e];
              fVar166 = pfVar158[0x2f];
              fVar54 = pfVar155[0x28];
              fVar55 = pfVar155[0x29];
              fVar56 = pfVar155[0x2a];
              fVar57 = pfVar155[0x2b];
              fVar58 = pfVar155[0x2c];
              fVar80 = pfVar155[0x2d];
              fVar172 = pfVar155[0x2e];
              fVar168 = fVar171 + fVar167;
              fVar179 = fVar45 + fStack_1dc + fVar73 + fVar93;
              fVar45 = pfVar156[0x28];
              fVar81 = pfVar156[0x29];
              fVar82 = pfVar156[0x2a];
              fVar83 = pfVar156[0x2b];
              fVar84 = pfVar156[0x2c];
              fVar85 = pfVar156[0x2d];
              fVar99 = pfVar156[0x2e];
              fVar171 = fVar179 + fVar174 + fVar171 + fVar168;
              fVar179 = fVar179 + fVar170 + fVar174;
              pfVar157[0x10] =
                   fVar79 * local_b8 + fVar164 * local_158 + fVar51 * fVar124 +
                   fVar29 * local_198 + local_1f8 + fVar60 * fVar100 + fVar86 * fVar108 +
                   fVar38 * local_178 + fVar66 * local_1b8 + fVar175 * fVar116;
              pfVar157[0x11] =
                   fVar165 * fStack_b4 + fVar28 * fStack_154 + fVar59 * fVar125 +
                   fVar31 * fStack_194 + fStack_1f4 + fVar173 * fVar101 + fVar87 * fVar109 +
                   fVar39 * fStack_174 + fVar67 * fStack_1b4 + fVar176 * fVar117;
              pfVar157[0x12] =
                   fVar94 * fStack_b0 + fVar46 * fStack_150 + fVar74 * fVar126 +
                   fVar32 * fStack_190 + fStack_1f0 + fVar61 * fVar102 + fVar88 * fVar110 +
                   fVar40 * fStack_170 + fVar68 * fStack_1b0 + fVar92 * fVar118;
              pfVar157[0x13] =
                   fVar95 * fStack_ac + fVar47 * fStack_14c + fVar75 * fVar127 +
                   fVar33 * fStack_18c + fStack_1ec + fVar62 * fVar103 + fVar89 * fVar111 +
                   fVar41 * fStack_16c + fVar69 * fStack_1ac + fVar177 * fVar119;
              pfVar157[0x14] =
                   fVar96 * fStack_a8 + fVar48 * fStack_148 + fVar76 * fVar128 +
                   fVar34 * fStack_188 + fStack_1e8 + fVar63 * fVar104 + fVar90 * fVar112 +
                   fVar42 * fStack_168 + fVar70 * fStack_1a8 + fVar180 * fVar120;
              pfVar157[0x15] =
                   fVar97 * fStack_a4 + fVar49 * fStack_144 + fVar77 * fVar129 +
                   fVar35 * fStack_184 + fStack_1e4 + fVar64 * fVar105 + fVar91 * fVar113 +
                   fVar43 * fStack_164 + fVar71 * fStack_1a4 + fVar181 * fVar121;
              pfVar157[0x16] =
                   fVar98 * fStack_a0 + fVar50 * fStack_140 + fVar78 * fVar130 +
                   fVar36 * fStack_180 + fStack_1e0 + fVar65 * fVar106 + fVar163 * fVar114 +
                   fVar44 * fStack_160 + fVar72 * fStack_1a0 + fVar182 * fVar122;
              pfVar157[0x17] =
                   fVar73 + fVar93 + fVar168 + fVar37 + fStack_1dc + fVar169 + fVar174 + fVar167;
              fVar29 = pfVar158[0x30];
              fVar31 = pfVar158[0x31];
              fVar32 = pfVar158[0x32];
              fVar33 = pfVar158[0x33];
              fVar34 = pfVar158[0x34];
              fVar35 = pfVar158[0x35];
              fVar36 = pfVar158[0x36];
              in_register_000014dc = pfVar158[0x37];
              fVar37 = pfVar155[0x30];
              fVar60 = pfVar155[0x31];
              fVar173 = pfVar155[0x32];
              fVar61 = pfVar155[0x33];
              fVar62 = pfVar155[0x34];
              fVar63 = pfVar155[0x35];
              fVar64 = pfVar155[0x36];
              fVar65 = pfVar156[0x30];
              fVar73 = pfVar156[0x31];
              fVar86 = pfVar156[0x32];
              fVar87 = pfVar156[0x33];
              fVar88 = pfVar156[0x34];
              fVar89 = pfVar156[0x35];
              fVar90 = pfVar156[0x36];
              pfVar157[0x18] =
                   fVar38 * local_198 + local_1f8 + fVar66 * fVar100 + fVar175 * fVar108 +
                   fVar164 * local_178 + fVar51 * local_1b8 + fVar79 * fVar116 +
                   local_b8 * fVar45 + fVar22 * local_158 + fVar54 * fVar124;
              pfVar157[0x19] =
                   fVar39 * fStack_194 + fStack_1f4 + fVar67 * fVar101 + fVar176 * fVar109 +
                   fVar28 * fStack_174 + fVar59 * fStack_1b4 + fVar165 * fVar117 +
                   fStack_b4 * fVar81 + fVar23 * fStack_154 + fVar55 * fVar125;
              pfVar157[0x1a] =
                   fVar40 * fStack_190 + fStack_1f0 + fVar68 * fVar102 + fVar92 * fVar110 +
                   fVar46 * fStack_170 + fVar74 * fStack_1b0 + fVar94 * fVar118 +
                   fStack_b0 * fVar82 + fVar24 * fStack_150 + fVar56 * fVar126;
              pfVar157[0x1b] =
                   fVar41 * fStack_18c + fStack_1ec + fVar69 * fVar103 + fVar177 * fVar111 +
                   fVar47 * fStack_16c + fVar75 * fStack_1ac + fVar95 * fVar119 +
                   fStack_ac * fVar83 + fVar25 * fStack_14c + fVar57 * fVar127;
              pfVar157[0x1c] =
                   fVar42 * fStack_188 + fStack_1e8 + fVar70 * fVar104 + fVar180 * fVar112 +
                   fVar48 * fStack_168 + fVar76 * fStack_1a8 + fVar96 * fVar120 +
                   fStack_a8 * fVar84 + fVar26 * fStack_148 + fVar58 * fVar128;
              pfVar157[0x1d] =
                   fVar43 * fStack_184 + fStack_1e4 + fVar71 * fVar105 + fVar181 * fVar113 +
                   fVar49 * fStack_164 + fVar77 * fStack_1a4 + fVar97 * fVar121 +
                   fStack_a4 * fVar85 + fVar52 * fStack_144 + fVar80 * fVar129;
              pfVar157[0x1e] =
                   fVar44 * fStack_180 + fStack_1e0 + fVar72 * fVar106 + fVar182 * fVar114 +
                   fVar50 * fStack_160 + fVar78 * fStack_1a0 + fVar98 * fVar122 +
                   fStack_a0 * fVar99 + fVar53 * fStack_140 + fVar172 * fVar130;
              pfVar157[0x1f] = fVar171 + fVar179;
              fVar163 = fVar21 + fStack_1dc + fVar166 + fVar179 +
                        fVar171 + fVar179 + fVar171 + fVar21 + fStack_1dc;
              fVar38 = pfVar158[0x38];
              fVar39 = pfVar158[0x39];
              fVar40 = pfVar158[0x3a];
              fVar41 = pfVar158[0x3b];
              fVar42 = pfVar158[0x3c];
              fVar43 = pfVar158[0x3d];
              fVar44 = pfVar158[0x3e];
              fVar66 = pfVar155[0x38];
              fVar67 = pfVar155[0x39];
              fVar68 = pfVar155[0x3a];
              fVar69 = pfVar155[0x3b];
              fVar70 = pfVar155[0x3c];
              fVar71 = pfVar155[0x3d];
              fVar72 = pfVar155[0x3e];
              fVar91 = pfVar155[0x3f];
              fVar175 = fVar179 + fStack_1dc;
              fVar170 = fVar171 + fVar179 + fVar171;
              fVar171 = fVar171 + fVar175;
              fVar176 = fVar179 + fVar163 + fVar175;
              auVar17 = *(undefined1 (*) [32])(pfVar156 + 0x38);
              fVar21 = auVar17._0_4_;
              fVar166 = auVar17._4_4_;
              fVar167 = auVar17._8_4_;
              fVar168 = auVar17._12_4_;
              fVar179 = auVar17._16_4_;
              fVar27 = auVar17._20_4_;
              fVar30 = auVar17._24_4_;
              pfVar157[0x20] =
                   fVar29 * local_158 + fVar37 * fVar124 + fVar65 * local_b8 +
                   fVar164 * local_198 + local_1f8 + fVar51 * fVar100 + fVar79 * fVar108 +
                   fVar22 * local_178 + fVar54 * local_1b8 + fVar45 * fVar116;
              pfVar157[0x21] =
                   fVar31 * fStack_154 + fVar60 * fVar125 + fVar73 * fStack_b4 +
                   fVar28 * fStack_194 + fStack_1f4 + fVar59 * fVar101 + fVar165 * fVar109 +
                   fVar23 * fStack_174 + fVar55 * fStack_1b4 + fVar81 * fVar117;
              pfVar157[0x22] =
                   fVar32 * fStack_150 + fVar173 * fVar126 + fVar86 * fStack_b0 +
                   fVar46 * fStack_190 + fStack_1f0 + fVar74 * fVar102 + fVar94 * fVar110 +
                   fVar24 * fStack_170 + fVar56 * fStack_1b0 + fVar82 * fVar118;
              pfVar157[0x23] =
                   fVar33 * fStack_14c + fVar61 * fVar127 + fVar87 * fStack_ac +
                   fVar47 * fStack_18c + fStack_1ec + fVar75 * fVar103 + fVar95 * fVar111 +
                   fVar25 * fStack_16c + fVar57 * fStack_1ac + fVar83 * fVar119;
              pfVar157[0x24] =
                   fVar34 * fStack_148 + fVar62 * fVar128 + fVar88 * fStack_a8 +
                   fVar48 * fStack_188 + fStack_1e8 + fVar76 * fVar104 + fVar96 * fVar112 +
                   fVar26 * fStack_168 + fVar58 * fStack_1a8 + fVar84 * fVar120;
              pfVar157[0x25] =
                   fVar35 * fStack_144 + fVar63 * fVar129 + fVar89 * fStack_a4 +
                   fVar49 * fStack_184 + fStack_1e4 + fVar77 * fVar105 + fVar97 * fVar113 +
                   fVar52 * fStack_164 + fVar80 * fStack_1a4 + fVar85 * fVar121;
              pfVar157[0x26] =
                   fVar36 * fStack_140 + fVar64 * fVar130 + fVar90 * fStack_a0 +
                   fVar50 * fStack_180 + fStack_1e0 + fVar78 * fVar106 + fVar98 * fVar114 +
                   fVar53 * fStack_160 + fVar172 * fStack_1a0 + fVar99 * fVar122;
              pfVar157[0x27] = fVar170 + fVar163;
              fVar163 = fVar175 + fVar163 + fStack_9c + fVar176 + fVar171 + fVar170;
              fVar28 = pfVar158[0x40];
              fVar46 = pfVar158[0x41];
              fVar47 = pfVar158[0x42];
              fVar48 = pfVar158[0x43];
              fVar49 = pfVar158[0x44];
              fVar50 = pfVar158[0x45];
              fVar51 = pfVar158[0x46];
              fVar164 = pfVar158[0x47];
              uVar135 = *(undefined8 *)(pfVar155 + 0x40);
              uVar136 = *(undefined8 *)(pfVar155 + 0x42);
              uVar137 = *(undefined8 *)(pfVar155 + 0x44);
              uVar138 = *(undefined8 *)(pfVar155 + 0x46);
              auVar17 = *(undefined1 (*) [32])(pfVar156 + 0x40);
              pfVar157[0x28] =
                   local_198 * fVar22 + local_1f8 + fVar54 * fVar100 + fVar45 * fVar108 +
                   fVar29 * local_178 + fVar37 * local_1b8 + fVar65 * fVar116 +
                   local_158 * fVar38 + fVar66 * fVar124 + local_b8 * fVar21;
              pfVar157[0x29] =
                   fStack_194 * fVar23 + fStack_1f4 + fVar55 * fVar101 + fVar81 * fVar109 +
                   fVar31 * fStack_174 + fVar60 * fStack_1b4 + fVar73 * fVar117 +
                   fStack_154 * fVar39 + fVar67 * fVar125 + fStack_b4 * fVar166;
              pfVar157[0x2a] =
                   fStack_190 * fVar24 + fStack_1f0 + fVar56 * fVar102 + fVar82 * fVar110 +
                   fVar32 * fStack_170 + fVar173 * fStack_1b0 + fVar86 * fVar118 +
                   fStack_150 * fVar40 + fVar68 * fVar126 + fStack_b0 * fVar167;
              pfVar157[0x2b] =
                   fStack_18c * fVar25 + fStack_1ec + fVar57 * fVar103 + fVar83 * fVar111 +
                   fVar33 * fStack_16c + fVar61 * fStack_1ac + fVar87 * fVar119 +
                   fStack_14c * fVar41 + fVar69 * fVar127 + fStack_ac * fVar168;
              pfVar157[0x2c] =
                   fStack_188 * fVar26 + fStack_1e8 + fVar58 * fVar104 + fVar84 * fVar112 +
                   fVar34 * fStack_168 + fVar62 * fStack_1a8 + fVar88 * fVar120 +
                   fStack_148 * fVar42 + fVar70 * fVar128 + fStack_a8 * fVar179;
              pfVar157[0x2d] =
                   fStack_184 * fVar52 + fStack_1e4 + fVar80 * fVar105 + fVar85 * fVar113 +
                   fVar35 * fStack_164 + fVar63 * fStack_1a4 + fVar89 * fVar121 +
                   fStack_144 * fVar43 + fVar71 * fVar129 + fStack_a4 * fVar27;
              pfVar157[0x2e] =
                   fStack_180 * fVar53 + fStack_1e0 + fVar172 * fVar106 + fVar99 * fVar114 +
                   fVar36 * fStack_160 + fVar64 * fStack_1a0 + fVar90 * fVar122 +
                   fStack_140 * fVar44 + fVar72 * fVar130 + fStack_a0 * fVar30;
              pfVar157[0x2f] = fVar163;
              fVar176 = in_register_000014dc + fVar176;
              local_118 = (float)uVar135;
              fStack_114 = (float)((ulong)uVar135 >> 0x20);
              fStack_110 = (float)uVar136;
              fStack_10c = (float)((ulong)uVar136 >> 0x20);
              fStack_108 = (float)uVar137;
              fStack_104 = (float)((ulong)uVar137 >> 0x20);
              fStack_100 = (float)uVar138;
              fVar22 = pfVar158[0x48];
              fVar23 = pfVar158[0x49];
              fVar24 = pfVar158[0x4a];
              fVar25 = pfVar158[0x4b];
              fVar26 = pfVar158[0x4c];
              fVar45 = pfVar158[0x4d];
              fVar52 = pfVar158[0x4e];
              fVar172 = in_register_000014dc + fVar176 + fVar176;
              fVar53 = pfVar155[0x48];
              fVar54 = pfVar155[0x49];
              fVar55 = pfVar155[0x4a];
              fVar56 = pfVar155[0x4b];
              fVar57 = pfVar155[0x4c];
              fVar58 = pfVar155[0x4d];
              fVar59 = pfVar155[0x4e];
              in_register_000012dc = fVar164 + fVar172;
              fVar74 = pfVar156[0x48];
              fVar75 = pfVar156[0x49];
              fVar76 = pfVar156[0x4a];
              fVar77 = pfVar156[0x4b];
              fVar78 = pfVar156[0x4c];
              fVar79 = pfVar156[0x4d];
              fVar80 = pfVar156[0x4e];
              in_register_0000129c = in_register_000012dc + fStack_1dc;
              pfVar157[0x30] =
                   fVar29 * local_198 + local_1f8 + fVar108 * fVar65 + fVar37 * fVar100 +
                   local_178 * fVar38 + fVar66 * local_1b8 + fVar21 * fVar116 +
                   local_158 * fVar28 + fVar124 * local_118 + local_b8 * auVar17._0_4_;
              pfVar157[0x31] =
                   fVar31 * fStack_194 + fStack_1f4 + fVar109 * fVar73 + fVar60 * fVar101 +
                   fStack_174 * fVar39 + fVar67 * fStack_1b4 + fVar166 * fVar117 +
                   fStack_154 * fVar46 + fVar125 * fStack_114 + fStack_b4 * auVar17._4_4_;
              pfVar157[0x32] =
                   fVar32 * fStack_190 + fStack_1f0 + fVar110 * fVar86 + fVar173 * fVar102 +
                   fStack_170 * fVar40 + fVar68 * fStack_1b0 + fVar167 * fVar118 +
                   fStack_150 * fVar47 + fVar126 * fStack_110 + fStack_b0 * auVar17._8_4_;
              pfVar157[0x33] =
                   fVar33 * fStack_18c + fStack_1ec + fVar111 * fVar87 + fVar61 * fVar103 +
                   fStack_16c * fVar41 + fVar69 * fStack_1ac + fVar168 * fVar119 +
                   fStack_14c * fVar48 + fVar127 * fStack_10c + fStack_ac * auVar17._12_4_;
              pfVar157[0x34] =
                   fVar34 * fStack_188 + fStack_1e8 + fVar112 * fVar88 + fVar62 * fVar104 +
                   fStack_168 * fVar42 + fVar70 * fStack_1a8 + fVar179 * fVar120 +
                   fStack_148 * fVar49 + fVar128 * fStack_108 + fStack_a8 * auVar17._16_4_;
              pfVar157[0x35] =
                   fVar35 * fStack_184 + fStack_1e4 + fVar113 * fVar89 + fVar63 * fVar105 +
                   fStack_164 * fVar43 + fVar71 * fStack_1a4 + fVar27 * fVar121 +
                   fStack_144 * fVar50 + fVar129 * fStack_104 + fStack_a4 * auVar17._20_4_;
              pfVar157[0x36] =
                   fVar36 * fStack_180 + fStack_1e0 + fVar114 * fVar90 + fVar64 * fVar106 +
                   fStack_160 * fVar44 + fVar72 * fStack_1a0 + fVar30 * fVar122 +
                   fStack_140 * fVar51 + fVar130 * fStack_100 + fStack_a0 * auVar17._24_4_;
              pfVar157[0x37] =
                   fVar171 + fStack_1dc + fVar176 + fVar163 + fVar171 + fVar176 + fVar172;
              fVar164 = fStack_17c + fStack_1dc + fVar91 + auVar17._28_4_ + in_register_0000129c +
                        in_register_000014dc + fVar176 + fStack_17c + fStack_1dc;
              pfVar157[0x38] =
                   local_198 * fVar38 + local_1f8 + fVar66 * fVar100 + fVar108 * fVar21 +
                   local_178 * fVar28 + local_1b8 * local_118 + auVar17._0_4_ * fVar116 +
                   local_158 * fVar22 + fVar124 * fVar53 + local_b8 * fVar74;
              pfVar157[0x39] =
                   fStack_194 * fVar39 + fStack_1f4 + fVar67 * fVar101 + fVar109 * fVar166 +
                   fStack_174 * fVar46 + fStack_1b4 * fStack_114 + auVar17._4_4_ * fVar117 +
                   fStack_154 * fVar23 + fVar125 * fVar54 + fStack_b4 * fVar75;
              pfVar157[0x3a] =
                   fStack_190 * fVar40 + fStack_1f0 + fVar68 * fVar102 + fVar110 * fVar167 +
                   fStack_170 * fVar47 + fStack_1b0 * fStack_110 + auVar17._8_4_ * fVar118 +
                   fStack_150 * fVar24 + fVar126 * fVar55 + fStack_b0 * fVar76;
              pfVar157[0x3b] =
                   fStack_18c * fVar41 + fStack_1ec + fVar69 * fVar103 + fVar111 * fVar168 +
                   fStack_16c * fVar48 + fStack_1ac * fStack_10c + auVar17._12_4_ * fVar119 +
                   fStack_14c * fVar25 + fVar127 * fVar56 + fStack_ac * fVar77;
              pfVar157[0x3c] =
                   fStack_188 * fVar42 + fStack_1e8 + fVar70 * fVar104 + fVar112 * fVar179 +
                   fStack_168 * fVar49 + fStack_1a8 * fStack_108 + auVar17._16_4_ * fVar120 +
                   fStack_148 * fVar26 + fVar128 * fVar57 + fStack_a8 * fVar78;
              pfVar157[0x3d] =
                   fStack_184 * fVar43 + fStack_1e4 + fVar71 * fVar105 + fVar113 * fVar27 +
                   fStack_164 * fVar50 + fStack_1a4 * fStack_104 + auVar17._20_4_ * fVar121 +
                   fStack_144 * fVar45 + fVar129 * fVar58 + fStack_a4 * fVar79;
              pfVar157[0x3e] =
                   fStack_180 * fVar44 + fStack_1e0 + fVar72 * fVar106 + fVar114 * fVar30 +
                   fStack_160 * fVar51 + fStack_1a0 * fStack_100 + auVar17._24_4_ * fVar122 +
                   fStack_140 * fVar52 + fVar130 * fVar59 + fStack_a0 * fVar80;
              pfVar157[0x3f] = fVar164;
              pfVar158 = pfVar158 + 0x40;
              pfVar155 = pfVar155 + 0x40;
              pfVar156 = pfVar156 + 0x40;
              pfVar157 = pfVar157 + 0x40;
              iVar148 = iVar148 + 8;
              in_register_0000159c = fVar115;
            } while (iVar148 < (int)uVar19);
            auVar178 = ZEXT3264(auVar16);
            uVar150 = uVar19 & 0xfffffff8;
            in_register_0000149c = fStack_15c;
          }
          fStack_13c = (float)((ulong)uVar134 >> 0x20);
          fVar21 = auVar15._28_4_;
          if ((int)(uVar150 | 3) < (int)uVar19) {
            lVar151 = 0;
            uVar149 = uVar150;
            fVar166 = fVar115;
            do {
              pfVar3 = (float *)((long)pfVar158 + lVar151);
              fVar168 = pfVar3[1];
              fVar27 = pfVar3[2];
              fVar22 = pfVar3[3];
              fVar24 = pfVar3[4];
              fVar26 = pfVar3[5];
              fVar29 = pfVar3[6];
              pfVar5 = (float *)((long)pfVar158 + lVar151 + 0x20);
              fVar33 = *pfVar5;
              fVar34 = pfVar5[1];
              fVar35 = pfVar5[2];
              fVar36 = pfVar5[3];
              fVar37 = pfVar5[4];
              fVar38 = pfVar5[5];
              fVar39 = pfVar5[6];
              fVar40 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar158 + lVar151 + 0x40);
              fVar41 = *pfVar5;
              fVar42 = pfVar5[1];
              fVar43 = pfVar5[2];
              fVar44 = pfVar5[3];
              fVar45 = pfVar5[4];
              fVar46 = pfVar5[5];
              fVar47 = pfVar5[6];
              fVar48 = pfVar5[7];
              puVar4 = (undefined8 *)((long)pfVar158 + lVar151 + 0x60);
              uVar135 = *puVar4;
              uVar136 = puVar4[1];
              uVar137 = puVar4[2];
              uVar138 = puVar4[3];
              fVar180 = auVar143._0_4_;
              fVar181 = auVar143._4_4_;
              fVar182 = auVar143._8_4_;
              pfVar5 = (float *)((long)pfVar155 + lVar151);
              fVar32 = pfVar5[1];
              fVar49 = pfVar5[2];
              fVar50 = pfVar5[3];
              fVar51 = pfVar5[4];
              fVar52 = pfVar5[5];
              fVar53 = pfVar5[6];
              pfVar6 = (float *)((long)pfVar155 + lVar151 + 0x20);
              fVar54 = *pfVar6;
              fVar55 = pfVar6[1];
              fVar56 = pfVar6[2];
              fVar57 = pfVar6[3];
              fVar58 = pfVar6[4];
              fVar59 = pfVar6[5];
              fVar60 = pfVar6[6];
              fVar173 = pfVar6[7];
              pfVar6 = (float *)((long)pfVar155 + lVar151 + 0x40);
              fVar61 = *pfVar6;
              fVar62 = pfVar6[1];
              fVar63 = pfVar6[2];
              fVar64 = pfVar6[3];
              fVar65 = pfVar6[4];
              fVar66 = pfVar6[5];
              fVar67 = pfVar6[6];
              fVar68 = pfVar6[7];
              puVar4 = (undefined8 *)((long)pfVar155 + lVar151 + 0x60);
              uVar139 = *puVar4;
              uVar140 = puVar4[1];
              uVar141 = puVar4[2];
              uVar142 = puVar4[3];
              pfVar12 = (float *)((long)pfVar156 + lVar151);
              fVar69 = pfVar12[1];
              fVar70 = pfVar12[2];
              fVar71 = pfVar12[3];
              fVar72 = pfVar12[4];
              fVar73 = pfVar12[5];
              fVar74 = pfVar12[6];
              pfVar6 = (float *)((long)pfVar156 + lVar151 + 0x20);
              fVar75 = *pfVar6;
              fVar76 = pfVar6[1];
              fVar77 = pfVar6[2];
              fVar78 = pfVar6[3];
              fVar79 = pfVar6[4];
              fVar80 = pfVar6[5];
              fVar172 = pfVar6[6];
              pfVar6 = (float *)((long)pfVar156 + lVar151 + 0x40);
              fVar81 = *pfVar6;
              fVar82 = pfVar6[1];
              fVar83 = pfVar6[2];
              fVar84 = pfVar6[3];
              fVar85 = pfVar6[4];
              fVar86 = pfVar6[5];
              fVar87 = pfVar6[6];
              auVar17 = *(undefined1 (*) [32])((long)pfVar156 + lVar151 + 0x60);
              fVar167 = auVar178._0_4_;
              fVar179 = auVar178._4_4_;
              fVar30 = auVar178._8_4_;
              fVar23 = auVar178._12_4_;
              fVar25 = auVar178._16_4_;
              fVar28 = auVar178._20_4_;
              fVar31 = auVar178._24_4_;
              fVar177 = in_register_0000159c + in_register_0000159c + fVar21;
              fVar164 = fVar164 + fStack_1dc + in_register_0000129c + fVar166 +
                        fVar107 + fVar21 + fVar21 + fVar177;
              pfVar6 = (float *)((long)pfVar157 + lVar151);
              *pfVar6 = local_198 * *pfVar3 + local_1f8 + fVar180 * fVar33 + local_158 * fVar41 +
                        fVar100 * *pfVar5 + fVar54 * local_1b8 + fVar124 * fVar61 +
                        fVar81 * fVar167 + fVar75 * fVar116 + fVar108 * *pfVar12;
              pfVar6[1] = fStack_194 * fVar168 + fStack_1f4 + fVar181 * fVar34 + fStack_154 * fVar42
                          + fVar101 * fVar32 + fVar55 * fStack_1b4 + fVar125 * fVar62 +
                          fVar82 * fVar179 + fVar76 * fVar117 + fVar109 * fVar69;
              pfVar6[2] = fStack_190 * fVar27 + fStack_1f0 + fVar182 * fVar35 + fStack_150 * fVar43
                          + fVar102 * fVar49 + fVar56 * fStack_1b0 + fVar126 * fVar63 +
                          fVar83 * fVar30 + fVar77 * fVar118 + fVar110 * fVar70;
              pfVar6[3] = fStack_18c * fVar22 + fStack_1ec +
                          fStack_16c * fVar36 + fStack_14c * fVar44 +
                          fVar103 * fVar50 + fVar57 * fStack_1ac + fVar127 * fVar64 +
                          fVar84 * fVar23 + fVar78 * fVar119 + fVar111 * fVar71;
              pfVar6[4] = fStack_188 * fVar24 + fStack_1e8 +
                          fStack_168 * fVar37 + fStack_148 * fVar45 +
                          fVar104 * fVar51 + fVar58 * fStack_1a8 + fVar128 * fVar65 +
                          fVar85 * fVar25 + fVar79 * fVar120 + fVar112 * fVar72;
              pfVar6[5] = fStack_184 * fVar26 + fStack_1e4 +
                          fStack_164 * fVar38 + fStack_144 * fVar46 +
                          fVar105 * fVar52 + fVar59 * fStack_1a4 + fVar129 * fVar66 +
                          fVar86 * fVar28 + fVar80 * fVar121 + fVar113 * fVar73;
              pfVar6[6] = fStack_180 * fVar29 + fStack_1e0 +
                          fStack_160 * fVar39 + fStack_140 * fVar47 +
                          fVar106 * fVar53 + fVar60 * fStack_1a0 + fVar130 * fVar67 +
                          fVar87 * fVar31 + fVar172 * fVar122 + fVar114 * fVar74;
              pfVar6[7] = fVar164;
              local_d8 = (float)uVar135;
              fStack_d4 = (float)((ulong)uVar135 >> 0x20);
              fStack_d0 = (float)uVar136;
              fStack_cc = (float)((ulong)uVar136 >> 0x20);
              fStack_c8 = (float)uVar137;
              fStack_c4 = (float)((ulong)uVar137 >> 0x20);
              fStack_c0 = (float)uVar138;
              fVar164 = fVar164 + fVar173;
              local_118 = (float)uVar139;
              fStack_114 = (float)((ulong)uVar139 >> 0x20);
              fStack_110 = (float)uVar140;
              fStack_10c = (float)((ulong)uVar140 >> 0x20);
              fStack_108 = (float)uVar141;
              fStack_104 = (float)((ulong)uVar141 >> 0x20);
              fStack_100 = (float)uVar142;
              fStack_fc = (float)((ulong)uVar142 >> 0x20);
              fVar173 = fVar177 + fVar173;
              fVar166 = fVar164 + fVar177 + fVar177;
              fVar168 = auVar17._0_4_;
              fVar27 = auVar17._4_4_;
              fVar22 = auVar17._8_4_;
              fVar24 = auVar17._12_4_;
              fVar26 = auVar17._16_4_;
              fVar29 = auVar17._20_4_;
              fVar32 = auVar17._24_4_;
              fVar164 = fVar40 + fStack_1dc + fVar164 + fVar166 + fVar173 + fVar166;
              pfVar3 = (float *)((long)pfVar158 + lVar151 + 0x80);
              fVar90 = *pfVar3;
              fVar91 = pfVar3[1];
              fVar163 = pfVar3[2];
              fVar170 = pfVar3[3];
              fVar175 = pfVar3[4];
              fVar176 = pfVar3[5];
              fVar92 = pfVar3[6];
              in_register_0000159c = pfVar3[7];
              pfVar3 = (float *)((long)pfVar155 + lVar151 + 0x80);
              fVar40 = *pfVar3;
              fVar49 = pfVar3[1];
              fVar50 = pfVar3[2];
              fVar51 = pfVar3[3];
              fVar52 = pfVar3[4];
              fVar53 = pfVar3[5];
              fVar69 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar156 + lVar151 + 0x80);
              fVar70 = *pfVar3;
              fVar71 = pfVar3[1];
              fVar72 = pfVar3[2];
              fVar73 = pfVar3[3];
              fVar74 = pfVar3[4];
              fVar88 = pfVar3[5];
              fVar89 = pfVar3[6];
              in_register_000012dc = pfVar3[7];
              pfVar3 = (float *)((long)pfVar157 + lVar151 + 0x20);
              *pfVar3 = local_198 * fVar33 + local_1f8 + fVar180 * fVar41 + fVar54 * fVar100 +
                        fVar61 * local_1b8 + fVar75 * fVar108 + fVar81 * fVar116 +
                        local_158 * local_d8 + local_118 * fVar124 + fVar167 * fVar168;
              pfVar3[1] = fStack_194 * fVar34 + fStack_1f4 + fVar181 * fVar42 + fVar55 * fVar101 +
                          fVar62 * fStack_1b4 + fVar76 * fVar109 + fVar82 * fVar117 +
                          fStack_154 * fStack_d4 + fStack_114 * fVar125 + fVar179 * fVar27;
              pfVar3[2] = fStack_190 * fVar35 + fStack_1f0 + fVar182 * fVar43 + fVar56 * fVar102 +
                          fVar63 * fStack_1b0 + fVar77 * fVar110 + fVar83 * fVar118 +
                          fStack_150 * fStack_d0 + fStack_110 * fVar126 + fVar30 * fVar22;
              pfVar3[3] = fStack_18c * fVar36 + fStack_1ec + fStack_16c * fVar44 + fVar57 * fVar103
                          + fVar64 * fStack_1ac + fVar78 * fVar111 + fVar84 * fVar119 +
                          fStack_14c * fStack_cc + fStack_10c * fVar127 + fVar23 * fVar24;
              pfVar3[4] = fStack_188 * fVar37 + fStack_1e8 + fStack_168 * fVar45 + fVar58 * fVar104
                          + fVar65 * fStack_1a8 + fVar79 * fVar112 + fVar85 * fVar120 +
                          fStack_148 * fStack_c8 + fStack_108 * fVar128 + fVar25 * fVar26;
              pfVar3[5] = fStack_184 * fVar38 + fStack_1e4 + fStack_164 * fVar46 + fVar59 * fVar105
                          + fVar66 * fStack_1a4 + fVar80 * fVar113 + fVar86 * fVar121 +
                          fStack_144 * fStack_c4 + fStack_104 * fVar129 + fVar28 * fVar29;
              pfVar3[6] = fStack_180 * fVar39 + fStack_1e0 + fStack_160 * fVar47 + fVar60 * fVar106
                          + fVar67 * fStack_1a0 + fVar172 * fVar114 + fVar87 * fVar122 +
                          fStack_140 * fStack_c0 + fStack_100 * fVar130 + fVar31 * fVar32;
              pfVar3[7] = fVar164;
              fVar164 = fVar164 + fVar177 + fVar68 + fVar177;
              fVar166 = fVar173 + fVar177 + fVar164;
              fVar164 = fStack_1dc + fVar48 + fVar68 + fVar177 + fVar164 + fVar166;
              pfVar3 = (float *)((long)pfVar158 + lVar151 + 0xa0);
              fVar33 = *pfVar3;
              fVar34 = pfVar3[1];
              fVar35 = pfVar3[2];
              fVar36 = pfVar3[3];
              fVar37 = pfVar3[4];
              fVar38 = pfVar3[5];
              fVar39 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar155 + lVar151 + 0xa0);
              fVar48 = *pfVar3;
              fVar54 = pfVar3[1];
              fVar55 = pfVar3[2];
              fVar56 = pfVar3[3];
              fVar57 = pfVar3[4];
              fVar58 = pfVar3[5];
              fVar59 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar156 + lVar151 + 0xa0);
              fVar60 = *pfVar3;
              fVar173 = pfVar3[1];
              fVar68 = pfVar3[2];
              fVar75 = pfVar3[3];
              fVar76 = pfVar3[4];
              fVar77 = pfVar3[5];
              fVar78 = pfVar3[6];
              in_register_0000129c = fVar166 + fVar131 + fVar131;
              pfVar3 = (float *)((long)pfVar157 + lVar151 + 0x40);
              *pfVar3 = local_1f8 + auVar144._0_4_ * fVar41 + fVar61 * fVar100 + fVar81 * fVar108 +
                        fVar180 * local_d8 + local_118 * local_1b8 + fVar168 * fVar116 +
                        fVar90 * local_158 + fVar40 * fVar124 + fVar167 * fVar70;
              pfVar3[1] = fStack_1f4 + auVar144._4_4_ * fVar42 + fVar62 * fVar101 + fVar82 * fVar109
                          + fVar181 * fStack_d4 + fStack_114 * fStack_1b4 + fVar27 * fVar117 +
                          fVar91 * fStack_154 + fVar49 * fVar125 + fVar179 * fVar71;
              pfVar3[2] = fStack_1f0 + auVar144._8_4_ * fVar43 + fVar63 * fVar102 + fVar83 * fVar110
                          + fVar182 * fStack_d0 + fStack_110 * fStack_1b0 + fVar22 * fVar118 +
                          fVar163 * fStack_150 + fVar50 * fVar126 + fVar30 * fVar72;
              pfVar3[3] = fStack_1ec + fStack_18c * fVar44 + fVar64 * fVar103 + fVar84 * fVar111 +
                          fStack_16c * fStack_cc + fStack_10c * fStack_1ac + fVar24 * fVar119 +
                          fVar170 * fStack_14c + fVar51 * fVar127 + fVar23 * fVar73;
              pfVar3[4] = fStack_1e8 + fStack_188 * fVar45 + fVar65 * fVar104 + fVar85 * fVar112 +
                          fStack_168 * fStack_c8 + fStack_108 * fStack_1a8 + fVar26 * fVar120 +
                          fVar175 * fStack_148 + fVar52 * fVar128 + fVar25 * fVar74;
              pfVar3[5] = fStack_1e4 + fStack_184 * fVar46 + fVar66 * fVar105 + fVar86 * fVar113 +
                          fStack_164 * fStack_c4 + fStack_104 * fStack_1a4 + fVar29 * fVar121 +
                          fVar176 * fStack_144 + fVar53 * fVar129 + fVar28 * fVar88;
              pfVar3[6] = fStack_1e0 + fStack_180 * fVar47 + fVar67 * fVar106 + fVar87 * fVar114 +
                          fStack_160 * fStack_c0 + fStack_100 * fStack_1a0 + fVar32 * fVar122 +
                          fVar92 * fStack_140 + fVar69 * fVar130 + fVar31 * fVar89;
              pfVar3[7] = fVar164;
              fVar166 = fStack_1dc + fVar131;
              auVar178 = ZEXT3264(auVar178._0_32_);
              fVar164 = fVar166 + fVar131 + fStack_fc + fVar164 + fVar131 + in_register_000012dc +
                        in_register_0000129c;
              pfVar3 = (float *)((long)pfVar157 + lVar151 + 0x60);
              *pfVar3 = local_1f8 + auVar144._0_4_ * local_d8 +
                        local_118 * fVar100 + fVar108 * fVar168 +
                        fVar90 * fVar180 + fVar40 * local_1b8 + fVar70 * fVar116 +
                        local_158 * fVar33 + fVar124 * fVar48 + fVar167 * fVar60;
              pfVar3[1] = fStack_1f4 + auVar144._4_4_ * fStack_d4 +
                          fStack_114 * fVar101 + fVar109 * fVar27 +
                          fVar91 * fVar181 + fVar49 * fStack_1b4 + fVar71 * fVar117 +
                          fStack_154 * fVar34 + fVar125 * fVar54 + fVar179 * fVar173;
              pfVar3[2] = fStack_1f0 + auVar144._8_4_ * fStack_d0 +
                          fStack_110 * fVar102 + fVar110 * fVar22 +
                          fVar163 * fVar182 + fVar50 * fStack_1b0 + fVar72 * fVar118 +
                          fStack_150 * fVar35 + fVar126 * fVar55 + fVar30 * fVar68;
              pfVar3[3] = fStack_1ec + fStack_18c * fStack_cc +
                          fStack_10c * fVar103 + fVar111 * fVar24 +
                          fVar170 * fStack_16c + fVar51 * fStack_1ac + fVar73 * fVar119 +
                          fStack_14c * fVar36 + fVar127 * fVar56 + fVar23 * fVar75;
              pfVar3[4] = fStack_1e8 + fStack_188 * fStack_c8 +
                          fStack_108 * fVar104 + fVar112 * fVar26 +
                          fVar175 * fStack_168 + fVar52 * fStack_1a8 + fVar74 * fVar120 +
                          fStack_148 * fVar37 + fVar128 * fVar57 + fVar25 * fVar76;
              pfVar3[5] = fStack_1e4 + fStack_184 * fStack_c4 +
                          fStack_104 * fVar105 + fVar113 * fVar29 +
                          fVar176 * fStack_164 + fVar53 * fStack_1a4 + fVar88 * fVar121 +
                          fStack_144 * fVar38 + fVar129 * fVar58 + fVar28 * fVar77;
              pfVar3[6] = fStack_1e0 + fStack_180 * fStack_c0 +
                          fStack_100 * fVar106 + fVar114 * fVar32 +
                          fVar92 * fStack_160 + fVar69 * fStack_1a0 + fVar89 * fVar122 +
                          fStack_140 * fVar39 + fVar130 * fVar59 + fVar31 * fVar78;
              pfVar3[7] = fVar164;
              uVar150 = uVar149 + 4;
              lVar151 = lVar151 + 0x80;
              iVar148 = uVar149 + 7;
              uVar149 = uVar150;
            } while (iVar148 < (int)uVar19);
            pfVar157 = (float *)((long)pfVar157 + lVar151);
            pfVar158 = (float *)((long)pfVar158 + lVar151);
            pfVar155 = (float *)((long)pfVar155 + lVar151);
            pfVar156 = (float *)((long)pfVar156 + lVar151);
            in_register_0000149c = fStack_13c;
            in_register_000014dc = fVar115;
          }
          if ((int)(uVar150 | 1) < (int)uVar19) {
            lVar151 = 0;
            uVar149 = uVar150;
            do {
              pfVar3 = (float *)((long)pfVar158 + lVar151 + 0x20);
              fVar166 = *pfVar3;
              fVar167 = pfVar3[1];
              fVar168 = pfVar3[2];
              fVar179 = pfVar3[3];
              fVar27 = pfVar3[4];
              fVar30 = pfVar3[5];
              fVar22 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar158 + lVar151 + 0x40);
              fVar23 = *pfVar3;
              fVar24 = pfVar3[1];
              fVar25 = pfVar3[2];
              fVar26 = pfVar3[3];
              fVar28 = pfVar3[4];
              fVar29 = pfVar3[5];
              fVar31 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar155 + lVar151 + 0x20);
              fVar32 = *pfVar3;
              fVar33 = pfVar3[1];
              fVar34 = pfVar3[2];
              fVar35 = pfVar3[3];
              fVar36 = pfVar3[4];
              fVar37 = pfVar3[5];
              fVar38 = pfVar3[6];
              fVar164 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar155 + lVar151 + 0x40);
              fVar39 = *pfVar3;
              fVar40 = pfVar3[1];
              fVar41 = pfVar3[2];
              fVar42 = pfVar3[3];
              fVar43 = pfVar3[4];
              fVar44 = pfVar3[5];
              fVar45 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar156 + lVar151 + 0x20);
              fVar46 = *pfVar3;
              fVar47 = pfVar3[1];
              fVar48 = pfVar3[2];
              fVar49 = pfVar3[3];
              fVar50 = pfVar3[4];
              fVar51 = pfVar3[5];
              fVar52 = pfVar3[6];
              in_register_0000129c = pfVar3[7];
              pfVar3 = (float *)((long)pfVar158 + lVar151);
              fVar53 = pfVar3[1];
              fVar54 = pfVar3[2];
              fVar55 = pfVar3[3];
              fVar56 = pfVar3[4];
              fVar57 = pfVar3[5];
              fVar58 = pfVar3[6];
              pfVar5 = (float *)((long)pfVar156 + lVar151 + 0x40);
              fVar90 = *pfVar5;
              fVar91 = pfVar5[1];
              fVar163 = pfVar5[2];
              fVar170 = pfVar5[3];
              fVar175 = pfVar5[4];
              fVar176 = pfVar5[5];
              fVar92 = pfVar5[6];
              in_register_0000159c = pfVar5[7];
              fVar177 = in_register_0000149c + in_register_000014dc;
              pfVar5 = (float *)((long)pfVar155 + lVar151);
              fVar59 = pfVar5[1];
              fVar60 = pfVar5[2];
              fVar173 = pfVar5[3];
              fVar61 = pfVar5[4];
              fVar62 = pfVar5[5];
              fVar63 = pfVar5[6];
              fVar180 = fVar177 + in_register_000014dc + in_register_000014dc;
              pfVar12 = (float *)((long)pfVar156 + lVar151);
              fVar64 = pfVar12[1];
              fVar65 = pfVar12[2];
              fVar66 = pfVar12[3];
              fVar67 = pfVar12[4];
              fVar68 = pfVar12[5];
              fVar69 = pfVar12[6];
              fVar181 = fVar180 + in_register_000014dc + in_register_000014dc;
              pfVar6 = (float *)((long)pfVar158 + lVar151 + 0x60);
              fVar70 = *pfVar6;
              fVar71 = pfVar6[1];
              fVar72 = pfVar6[2];
              fVar73 = pfVar6[3];
              fVar74 = pfVar6[4];
              fVar75 = pfVar6[5];
              fVar76 = pfVar6[6];
              pfVar6 = (float *)((long)pfVar155 + lVar151 + 0x60);
              fVar77 = *pfVar6;
              fVar78 = pfVar6[1];
              fVar79 = pfVar6[2];
              fVar80 = pfVar6[3];
              fVar172 = pfVar6[4];
              fVar81 = pfVar6[5];
              fVar82 = pfVar6[6];
              pfVar6 = (float *)((long)pfVar156 + lVar151 + 0x60);
              fVar83 = *pfVar6;
              fVar84 = pfVar6[1];
              fVar85 = pfVar6[2];
              fVar86 = pfVar6[3];
              fVar87 = pfVar6[4];
              fVar88 = pfVar6[5];
              fVar89 = pfVar6[6];
              in_register_0000149c = fVar181 + in_register_000014dc + in_register_000014dc;
              pfVar6 = (float *)((long)pfVar157 + lVar151);
              *pfVar6 = auVar146._0_4_ * *pfVar12 + fVar46 * auVar147._0_4_ + fVar90 * local_b8 +
                        fVar100 * *pfVar5 + fVar32 * local_1b8 + fVar39 * fVar124 +
                        fVar166 * local_178 + fVar23 * local_158 +
                        local_1f8 + auVar145._0_4_ * *pfVar3;
              pfVar6[1] = auVar146._4_4_ * fVar64 + fVar47 * auVar147._4_4_ + fVar91 * fStack_b4 +
                          fVar101 * fVar59 + fVar33 * fStack_1b4 + fVar40 * fVar125 +
                          fVar167 * fStack_174 + fVar24 * fStack_154 +
                          fStack_1f4 + auVar145._4_4_ * fVar53;
              pfVar6[2] = auVar146._8_4_ * fVar65 + fVar48 * auVar147._8_4_ + fVar163 * fStack_b0 +
                          fVar102 * fVar60 + fVar34 * fStack_1b0 + fVar41 * fVar126 +
                          fVar168 * fStack_170 + fVar25 * fStack_150 +
                          fStack_1f0 + auVar145._8_4_ * fVar54;
              pfVar6[3] = auVar146._12_4_ * fVar66 + fVar49 * auVar147._12_4_ + fVar170 * fStack_ac
                          + fVar103 * fVar173 + fVar35 * fStack_1ac + fVar42 * fVar127 +
                            fVar179 * fStack_16c + fVar26 * fStack_14c +
                            fStack_1ec + fStack_18c * fVar55;
              pfVar6[4] = auVar146._16_4_ * fVar67 + fVar50 * auVar147._16_4_ + fVar175 * fStack_a8
                          + fVar104 * fVar61 + fVar36 * fStack_1a8 + fVar43 * fVar128 +
                            fVar27 * fStack_168 + fVar28 * fStack_148 +
                            fStack_1e8 + fStack_188 * fVar56;
              pfVar6[5] = auVar146._20_4_ * fVar68 + fVar51 * auVar147._20_4_ + fVar176 * fStack_a4
                          + fVar105 * fVar62 + fVar37 * fStack_1a4 + fVar44 * fVar129 +
                            fVar30 * fStack_164 + fVar29 * fStack_144 +
                            fStack_1e4 + fStack_184 * fVar57;
              pfVar6[6] = auVar146._24_4_ * fVar69 + fVar52 * auVar147._24_4_ + fVar92 * fStack_a0 +
                          fVar106 * fVar63 + fVar38 * fStack_1a0 + fVar45 * fVar130 +
                          fVar22 * fStack_160 + fVar31 * fStack_140 +
                          fStack_1e0 + fStack_180 * fVar58;
              pfVar6[7] = fVar181 + fVar180 + fVar177 + fStack_1dc + fVar21;
              fVar164 = in_register_0000149c +
                        fStack_1dc + fStack_9c + fStack_15c + fVar164 +
                        fVar131 + in_register_0000129c + in_register_0000129c;
              pfVar3 = (float *)((long)pfVar157 + lVar151 + 0x20);
              *pfVar3 = local_158 * fVar70 + fVar124 * fVar77 + local_b8 * fVar83 +
                        local_1f8 + auVar145._0_4_ * fVar166 + fVar23 * local_178 + fVar32 * fVar100
                        + local_1b8 * fVar39 + auVar146._0_4_ * fVar46 + fVar90 * auVar147._0_4_;
              pfVar3[1] = fStack_154 * fVar71 + fVar125 * fVar78 + fStack_b4 * fVar84 +
                          fStack_1f4 + auVar145._4_4_ * fVar167 +
                          fVar24 * fStack_174 + fVar33 * fVar101 +
                          fStack_1b4 * fVar40 + auVar146._4_4_ * fVar47 + fVar91 * auVar147._4_4_;
              pfVar3[2] = fStack_150 * fVar72 + fVar126 * fVar79 + fStack_b0 * fVar85 +
                          fStack_1f0 + auVar145._8_4_ * fVar168 +
                          fVar25 * fStack_170 + fVar34 * fVar102 +
                          fStack_1b0 * fVar41 + auVar146._8_4_ * fVar48 + fVar163 * auVar147._8_4_;
              pfVar3[3] = fStack_14c * fVar73 + fVar127 * fVar80 + fStack_ac * fVar86 +
                          fStack_1ec + fStack_18c * fVar179 + fVar26 * fStack_16c + fVar35 * fVar103
                          + fStack_1ac * fVar42 + auVar146._12_4_ * fVar49 +
                            fVar170 * auVar147._12_4_;
              pfVar3[4] = fStack_148 * fVar74 + fVar128 * fVar172 + fStack_a8 * fVar87 +
                          fStack_1e8 + fStack_188 * fVar27 + fVar28 * fStack_168 + fVar36 * fVar104
                          + fStack_1a8 * fVar43 + auVar146._16_4_ * fVar50 +
                            fVar175 * auVar147._16_4_;
              pfVar3[5] = fStack_144 * fVar75 + fVar129 * fVar81 + fStack_a4 * fVar88 +
                          fStack_1e4 + fStack_184 * fVar30 + fVar29 * fStack_164 + fVar37 * fVar105
                          + fStack_1a4 * fVar44 + auVar146._20_4_ * fVar51 +
                            fVar176 * auVar147._20_4_;
              pfVar3[6] = fStack_140 * fVar76 + fVar130 * fVar82 + fStack_a0 * fVar89 +
                          fStack_1e0 + fStack_180 * fVar22 + fVar31 * fStack_160 + fVar38 * fVar106
                          + fStack_1a0 * fVar45 + auVar146._24_4_ * fVar52 +
                            fVar92 * auVar147._24_4_;
              pfVar3[7] = fVar164;
              uVar150 = uVar149 + 2;
              lVar151 = lVar151 + 0x40;
              iVar148 = uVar149 + 3;
              uVar149 = uVar150;
            } while (iVar148 < (int)uVar19);
            pfVar157 = (float *)((long)pfVar157 + lVar151);
            pfVar158 = (float *)((long)pfVar158 + lVar151);
            pfVar155 = (float *)((long)pfVar155 + lVar151);
            pfVar156 = (float *)((long)pfVar156 + lVar151);
            auVar178 = ZEXT3264(auVar16);
            in_register_000012dc = fVar107;
          }
          iVar148 = uVar19 - uVar150;
          if (iVar148 != 0 && (int)uVar150 <= (int)uVar19) {
            lVar152 = 0x40;
            lVar151 = 0;
            do {
              pfVar6 = (float *)((long)pfVar158 + lVar152 + -0x40);
              fVar21 = pfVar6[1];
              fVar166 = pfVar6[2];
              fVar167 = pfVar6[3];
              fVar168 = pfVar6[4];
              fVar179 = pfVar6[5];
              fVar27 = pfVar6[6];
              pfVar12 = (float *)((long)pfVar158 + lVar152 + -0x20);
              fVar30 = pfVar12[1];
              fVar22 = pfVar12[2];
              fVar23 = pfVar12[3];
              fVar24 = pfVar12[4];
              fVar25 = pfVar12[5];
              fVar26 = pfVar12[6];
              pfVar3 = (float *)((long)pfVar158 + lVar152);
              fVar28 = pfVar3[1];
              fVar29 = pfVar3[2];
              fVar31 = pfVar3[3];
              fVar32 = pfVar3[4];
              fVar33 = pfVar3[5];
              fVar34 = pfVar3[6];
              pfVar7 = (float *)((long)pfVar155 + lVar152 + -0x40);
              fVar35 = pfVar7[1];
              fVar36 = pfVar7[2];
              fVar37 = pfVar7[3];
              fVar38 = pfVar7[4];
              fVar39 = pfVar7[5];
              fVar40 = pfVar7[6];
              pfVar8 = (float *)((long)pfVar155 + lVar152 + -0x20);
              fVar41 = pfVar8[1];
              fVar42 = pfVar8[2];
              fVar43 = pfVar8[3];
              fVar44 = pfVar8[4];
              fVar45 = pfVar8[5];
              fVar46 = pfVar8[6];
              pfVar5 = (float *)((long)pfVar155 + lVar152);
              fVar47 = pfVar5[1];
              fVar48 = pfVar5[2];
              fVar49 = pfVar5[3];
              fVar50 = pfVar5[4];
              fVar51 = pfVar5[5];
              fVar52 = pfVar5[6];
              fVar164 = fVar107 + fStack_13c + in_register_000012dc;
              pfVar9 = (float *)((long)pfVar156 + lVar152 + -0x40);
              fVar53 = pfVar9[1];
              fVar54 = pfVar9[2];
              fVar55 = pfVar9[3];
              fVar56 = pfVar9[4];
              fVar57 = pfVar9[5];
              fVar58 = pfVar9[6];
              pfVar10 = (float *)((long)pfVar156 + lVar152 + -0x20);
              fVar59 = pfVar10[1];
              fVar60 = pfVar10[2];
              fVar173 = pfVar10[3];
              fVar61 = pfVar10[4];
              fVar62 = pfVar10[5];
              fVar63 = pfVar10[6];
              pfVar13 = (float *)((long)pfVar156 + lVar152);
              fVar64 = pfVar13[1];
              fVar65 = pfVar13[2];
              fVar66 = pfVar13[3];
              fVar67 = pfVar13[4];
              fVar68 = pfVar13[5];
              fVar69 = pfVar13[6];
              fVar164 = fStack_17c + fStack_1dc + fStack_15c + fStack_13c + fVar164 +
                        fStack_13c + fVar164 + fStack_13c;
              pfVar11 = (float *)((long)pfVar157 + lVar152 + -0x40);
              *pfVar11 = local_198 * *pfVar6 + local_1f8 +
                         local_178 * *pfVar12 + local_158 * *pfVar3 +
                         fVar100 * *pfVar7 + local_1b8 * *pfVar8 + fVar124 * *pfVar5 +
                         fVar108 * *pfVar9 + fVar116 * *pfVar10 + auVar178._0_4_ * *pfVar13;
              pfVar11[1] = fStack_194 * fVar21 + fStack_1f4 +
                           fStack_174 * fVar30 + fStack_154 * fVar28 +
                           fVar101 * fVar35 + fStack_1b4 * fVar41 + fVar125 * fVar47 +
                           fVar109 * fVar53 + fVar117 * fVar59 + auVar178._4_4_ * fVar64;
              pfVar11[2] = fStack_190 * fVar166 + fStack_1f0 +
                           fStack_170 * fVar22 + fStack_150 * fVar29 +
                           fVar102 * fVar36 + fStack_1b0 * fVar42 + fVar126 * fVar48 +
                           fVar110 * fVar54 + fVar118 * fVar60 + auVar178._8_4_ * fVar65;
              pfVar11[3] = fStack_18c * fVar167 + fStack_1ec +
                           fStack_16c * fVar23 + fStack_14c * fVar31 +
                           fVar103 * fVar37 + fStack_1ac * fVar43 + fVar127 * fVar49 +
                           fVar111 * fVar55 + fVar119 * fVar173 + auVar178._12_4_ * fVar66;
              pfVar11[4] = fStack_188 * fVar168 + fStack_1e8 +
                           fStack_168 * fVar24 + fStack_148 * fVar32 +
                           fVar104 * fVar38 + fStack_1a8 * fVar44 + fVar128 * fVar50 +
                           fVar112 * fVar56 + fVar120 * fVar61 + auVar178._16_4_ * fVar67;
              pfVar11[5] = fStack_184 * fVar179 + fStack_1e4 +
                           fStack_164 * fVar25 + fStack_144 * fVar33 +
                           fVar105 * fVar39 + fStack_1a4 * fVar45 + fVar129 * fVar51 +
                           fVar113 * fVar57 + fVar121 * fVar62 + auVar178._20_4_ * fVar68;
              pfVar11[6] = fStack_180 * fVar27 + fStack_1e0 +
                           fStack_160 * fVar26 + fStack_140 * fVar34 +
                           fVar106 * fVar40 + fStack_1a0 * fVar46 + fVar130 * fVar52 +
                           fVar114 * fVar58 + fVar122 * fVar63 + auVar178._24_4_ * fVar69;
              pfVar11[7] = fVar164;
              lVar151 = lVar151 + -0x20;
              lVar152 = lVar152 + 0x20;
              iVar148 = iVar148 + -1;
            } while (iVar148 != 0);
            pfVar157 = (float *)((long)pfVar157 - lVar151);
            pfVar158 = (float *)((long)pfVar158 - lVar151);
            pfVar155 = (float *)((long)pfVar155 - lVar151);
            pfVar156 = (float *)((long)pfVar156 - lVar151);
            in_register_0000129c = fStack_13c;
          }
          pfVar158 = pfVar158 + 0x10;
          pfVar155 = pfVar155 + 0x10;
          pfVar156 = pfVar156 + 0x10;
          iVar154 = iVar154 + 1;
        } while (iVar154 != iVar20);
      }
      lVar153 = lVar153 + 1;
    } while (lVar153 != iVar18);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_loadu_ps(k0);
        __m256 _k01 = _mm256_loadu_ps(k0 + 8);
        __m256 _k02 = _mm256_loadu_ps(k0 + 16);
        __m256 _k10 = _mm256_loadu_ps(k0 + 24);
        __m256 _k11 = _mm256_loadu_ps(k0 + 32);
        __m256 _k12 = _mm256_loadu_ps(k0 + 40);
        __m256 _k20 = _mm256_loadu_ps(k0 + 48);
        __m256 _k21 = _mm256_loadu_ps(k0 + 56);
        __m256 _k22 = _mm256_loadu_ps(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                __m256 _sum4 = _bias0;
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 24, _sum3);

                _sum4 = _mm256_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm256_comp_fmadd_ps(_k22, _r26, _sum4);

                __m256 _sum5 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                _mm256_storeu_ps(outptr0 + 32, _sum4);

                _sum5 = _mm256_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm256_comp_fmadd_ps(_k22, _r27, _sum5);

                __m256 _sum6 = _bias0;
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 40, _sum5);

                _sum6 = _mm256_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm256_comp_fmadd_ps(_k22, _r28, _sum6);

                __m256 _sum7 = _bias0;
                __m256 _r09 = _mm256_loadu_ps(r0 + 72);
                __m256 _r19 = _mm256_loadu_ps(r1 + 72);
                __m256 _r29 = _mm256_loadu_ps(r2 + 72);
                _mm256_storeu_ps(outptr0 + 48, _sum6);

                _sum7 = _mm256_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm256_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm256_storeu_ps(outptr0 + 56, _sum7);

                r0 += 64;
                r1 += 64;
                r2 += 64;
                outptr0 += 64;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}